

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBlock * AnalyzeNamespaceDefinition(ExpressionContext *ctx,SynNamespaceDefinition *syntax)

{
  ScopeData *pSVar1;
  SmallArray<NamespaceData_*,_2U> *pSVar2;
  int iVar3;
  uint uVar4;
  ScopeData *curr;
  undefined4 extraout_var;
  TypeBase *pTVar5;
  IdentifierLookupResult *pIVar6;
  NamespaceData **ppNVar7;
  ExprBase *node;
  ExprBlock *pEVar8;
  char *__function;
  NamespaceData *parent;
  SynIdentifier *pSVar9;
  SynBase *syntax_00;
  IntrusiveList<ExprBase> expressions;
  IntrusiveList<ExprBase> local_48;
  NamespaceData *this;
  undefined4 extraout_var_00;
  
  if ((ctx->scope != ctx->globalScope) && (ctx->scope->ownerNamespace == (NamespaceData *)0x0)) {
    anon_unknown.dwarf_11255e::Stop
              (ctx,&syntax->super_SynBase,
               "ERROR: a namespace definition must appear either at file scope or immediately within another namespace definition"
              );
  }
  pSVar9 = (syntax->path).head;
  if (pSVar9 != (SynIdentifier *)0x0) {
    do {
      for (pSVar1 = ctx->scope; pSVar1 != (ScopeData *)0x0; pSVar1 = pSVar1->scope) {
        parent = pSVar1->ownerNamespace;
        if (parent != (NamespaceData *)0x0) goto LAB_00204931;
      }
      parent = (NamespaceData *)0x0;
LAB_00204931:
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xa0);
      this = (NamespaceData *)CONCAT44(extraout_var,iVar3);
      uVar4 = ctx->uniqueNamespaceId;
      ctx->uniqueNamespaceId = uVar4 + 1;
      NamespaceData::NamespaceData
                (this,ctx->allocator,&syntax->super_SynBase,ctx->scope,parent,pSVar9,uVar4);
      pTVar5 = anon_unknown.dwarf_11255e::LookupTypeByName(ctx,this->fullNameHash);
      if (pTVar5 != (TypeBase *)0x0) {
        anon_unknown.dwarf_11255e::Report
                  (ctx,&syntax->super_SynBase,"ERROR: name \'%.*s\' is already taken for a type",
                   (ulong)(uint)(*(int *)&(this->name).name.end - (int)(this->name).name.begin));
      }
      uVar4 = NULLC::GetStringHash((this->name).name.begin,(this->name).name.end);
      pIVar6 = anon_unknown.dwarf_11255e::LookupObjectByName(ctx,uVar4);
      if (pIVar6 != (IdentifierLookupResult *)0x0) {
        if ((pIVar6->variable != (VariableData *)0x0) && (pIVar6->variable->scope == ctx->scope)) {
          anon_unknown.dwarf_11255e::Report
                    (ctx,&syntax->super_SynBase,
                     "ERROR: name \'%.*s\' is already taken for a variable in current scope",
                     (ulong)(uint)(*(int *)&(this->name).name.end - (int)(this->name).name.begin));
        }
        if ((pIVar6->function != (FunctionData *)0x0) && (pIVar6->function->scope == ctx->scope)) {
          anon_unknown.dwarf_11255e::Report
                    (ctx,&syntax->super_SynBase,
                     "ERROR: name \'%.*s\' is already taken for a function",
                     (ulong)(uint)(*(int *)&(this->name).name.end - (int)(this->name).name.begin));
        }
      }
      if (parent == (NamespaceData *)0x0) {
        uVar4 = (ctx->globalNamespaces).count;
        if (uVar4 == (ctx->globalNamespaces).max) {
          SmallArray<NamespaceData_*,_2U>::grow(&ctx->globalNamespaces,uVar4);
        }
        ppNVar7 = (ctx->globalNamespaces).data;
        pSVar2 = &ctx->globalNamespaces;
        if (ppNVar7 == (NamespaceData **)0x0) goto LAB_00204bdd;
      }
      else {
        uVar4 = (parent->children).count;
        if (uVar4 == (parent->children).max) {
          SmallArray<NamespaceData_*,_2U>::grow(&parent->children,uVar4);
        }
        ppNVar7 = (parent->children).data;
        if (ppNVar7 == (NamespaceData **)0x0) {
LAB_00204bdd:
          __function = 
          "void SmallArray<NamespaceData *, 2>::push_back(const T &) [T = NamespaceData *, N = 2]";
          goto LAB_00204c09;
        }
        pSVar2 = &parent->children;
      }
      uVar4 = pSVar2->count;
      pSVar2->count = uVar4 + 1;
      ppNVar7[uVar4] = this;
      uVar4 = (ctx->namespaces).count;
      if (uVar4 == (ctx->namespaces).max) {
        SmallArray<NamespaceData_*,_128U>::grow(&ctx->namespaces,uVar4);
      }
      ppNVar7 = (ctx->namespaces).data;
      if (ppNVar7 == (NamespaceData **)0x0) {
        __function = 
        "void SmallArray<NamespaceData *, 128>::push_back(const T &) [T = NamespaceData *, N = 128]"
        ;
LAB_00204c09:
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,__function);
      }
      uVar4 = (ctx->namespaces).count;
      (ctx->namespaces).count = uVar4 + 1;
      ppNVar7[uVar4] = this;
      ExpressionContext::PushScope(ctx,this);
      pSVar9 = (SynIdentifier *)(pSVar9->super_SynBase).next;
      if ((pSVar9 == (SynIdentifier *)0x0) || ((pSVar9->super_SynBase).typeID != 4)) {
        pSVar9 = (SynIdentifier *)0x0;
      }
    } while (pSVar9 != (SynIdentifier *)0x0);
  }
  local_48.head = (ExprBase *)0x0;
  local_48.tail = (ExprBase *)0x0;
  syntax_00 = (syntax->expressions).head;
  if (syntax_00 != (SynBase *)0x0) {
    do {
      node = AnalyzeStatement(ctx,syntax_00);
      IntrusiveList<ExprBase>::push_back(&local_48,node);
      syntax_00 = syntax_00->next;
    } while (syntax_00 != (SynBase *)0x0);
  }
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar8 = (ExprBlock *)CONCAT44(extraout_var_00,iVar3);
  pTVar5 = ctx->typeVoid;
  (pEVar8->super_ExprBase).typeID = 0x36;
  (pEVar8->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar8->super_ExprBase).type = pTVar5;
  (pEVar8->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar8->super_ExprBase).listed = false;
  (pEVar8->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6c90;
  (pEVar8->expressions).head = local_48.head;
  (pEVar8->expressions).tail = local_48.tail;
  pEVar8->closures = (ExprBase *)0x0;
  pSVar9 = (syntax->path).head;
  while (pSVar9 != (SynIdentifier *)0x0) {
    ExpressionContext::PopScope(ctx,SCOPE_NAMESPACE,true);
    pSVar9 = (SynIdentifier *)(pSVar9->super_SynBase).next;
    if ((pSVar9 == (SynIdentifier *)0x0) || ((pSVar9->super_SynBase).typeID != 4)) {
      pSVar9 = (SynIdentifier *)0x0;
    }
  }
  return pEVar8;
}

Assistant:

ExprBlock* AnalyzeNamespaceDefinition(ExpressionContext &ctx, SynNamespaceDefinition *syntax)
{
	if(ctx.scope != ctx.globalScope && ctx.scope->ownerNamespace == NULL)
		Stop(ctx, syntax, "ERROR: a namespace definition must appear either at file scope or immediately within another namespace definition");

	for(SynIdentifier *name = syntax->path.head; name; name = getType<SynIdentifier>(name->next))
	{
		NamespaceData *parent = ctx.GetCurrentNamespace(ctx.scope);

		NamespaceData *ns = new (ctx.get<NamespaceData>()) NamespaceData(ctx.allocator, syntax, ctx.scope, parent, *name, ctx.uniqueNamespaceId++);

		CheckNamespaceConflict(ctx, syntax, ns);

		if(parent)
			parent->children.push_back(ns);
		else
			ctx.globalNamespaces.push_back(ns);

		ctx.namespaces.push_back(ns);

		ctx.PushScope(ns);
	}

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
		expressions.push_back(AnalyzeStatement(ctx, expression));

	ExprBlock *block = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, NULL);

	for(SynIdentifier *name = syntax->path.head; name; name = getType<SynIdentifier>(name->next))
		ctx.PopScope(SCOPE_NAMESPACE);

	return block;
}